

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O0

void Exa3_ManExactSynthesis2(Bmc_EsPar_t *pPars)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Exa3_Man_t_conflict *p_00;
  abctime aVar4;
  abctime aVar5;
  abctime clk;
  word pTruth [16];
  int fCompl;
  Exa3_Man_t_conflict *p;
  abctime clkTotal;
  int local_18;
  int iMint;
  int status;
  int i;
  Bmc_EsPar_t *pPars_local;
  
  clkTotal._4_4_ = 1;
  _status = pPars;
  aVar3 = Abc_Clock();
  pTruth[0xf]._4_4_ = 0;
  Abc_TtReadHex((word *)&clk,_status->pTtStr);
  if (10 < _status->nVars) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                  ,0x527,"void Exa3_ManExactSynthesis2(Bmc_EsPar_t *)");
  }
  if (6 < _status->nLutSize) {
    __assert_fail("pPars->nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                  ,0x528,"void Exa3_ManExactSynthesis2(Bmc_EsPar_t *)");
  }
  p_00 = Exa3_ManAlloc(_status,(word *)&clk);
  if ((clk & 1U) != 0) {
    pTruth[0xf]._4_4_ = 1;
    Abc_TtNot((word *)&clk,p_00->nWords);
  }
  local_18 = Exa3_ManAddCnfStart(p_00,_status->fOnlyAnd);
  if (local_18 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                  ,0x52c,"void Exa3_ManExactSynthesis2(Bmc_EsPar_t *)");
  }
  printf("Running exact synthesis for %d-input function with %d %d-input LUTs...\n",
         (ulong)(uint)p_00->nVars,(ulong)(uint)p_00->nNodes,(ulong)(uint)p_00->nLutSize);
  iMint = 0;
  do {
    if (clkTotal._4_4_ == -1) {
LAB_0070c018:
      if (clkTotal._4_4_ == -1) {
        Exa3_ManPrintSolution(p_00,pTruth[0xf]._4_4_);
      }
      Exa3_ManFree(p_00);
      aVar4 = Abc_Clock();
      Abc_PrintTime(1,"Total runtime",aVar4 - aVar3);
      return;
    }
    aVar4 = Abc_Clock();
    iVar1 = Exa3_ManAddCnf(p_00,clkTotal._4_4_);
    if (iVar1 == 0) goto LAB_0070c018;
    local_18 = sat_solver_solve(p_00->pSat,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (_status->fVerbose != 0) {
      printf("Iter %3d : ",(ulong)(uint)iMint);
      Extra_PrintBinary(_stdout,(uint *)((long)&clkTotal + 4),p_00->nVars);
      printf("  Var =%5d  ",(ulong)(uint)p_00->iVar);
      uVar2 = sat_solver_nclauses(p_00->pSat);
      printf("Cla =%6d  ",(ulong)uVar2);
      uVar2 = sat_solver_nconflicts(p_00->pSat);
      printf("Conf =%9d  ",(ulong)uVar2);
      aVar5 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar5 - aVar4);
    }
    if (local_18 == -1) {
      printf("The problem has no solution.\n");
      goto LAB_0070c018;
    }
    clkTotal._4_4_ = Exa3_ManEval(p_00);
    iMint = iMint + 1;
  } while( true );
}

Assistant:

void Exa3_ManExactSynthesis2( Bmc_EsPar_t * pPars )
{
    int i, status, iMint = 1;
    abctime clkTotal = Abc_Clock();
    Exa3_Man_t * p; int fCompl = 0;
    word pTruth[16]; Abc_TtReadHex( pTruth, pPars->pTtStr );
    assert( pPars->nVars <= 10 );
    assert( pPars->nLutSize <= 6 );
    p = Exa3_ManAlloc( pPars, pTruth );
    if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, p->nWords ); }
    status = Exa3_ManAddCnfStart( p, pPars->fOnlyAnd );
    assert( status );
    printf( "Running exact synthesis for %d-input function with %d %d-input LUTs...\n", p->nVars, p->nNodes, p->nLutSize );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Exa3_ManAddCnf( p, iMint ) )
            break;
        status = sat_solver_solve( p->pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( pPars->fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", sat_solver_nclauses(p->pSat) );
            printf( "Conf =%9d  ", sat_solver_nconflicts(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == l_False )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Exa3_ManEval( p );
    }
    if ( iMint == -1 )
        Exa3_ManPrintSolution( p, fCompl );
    Exa3_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
}